

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int encode_uint(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,uint32_t value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  _Bool use_smallest;
  LOGGER_LOG l;
  int result;
  uint32_t value_local;
  void *context_local;
  AMQPVALUE_ENCODER_OUTPUT encoder_output_local;
  
  if (value == 0) {
    iVar1 = output_byte(encoder_output,context,'C');
    if (iVar1 == 0) {
      l._0_4_ = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                  ,"encode_uint",0xa5f,1,"Failed encoding uint");
      }
      l._0_4_ = 0xa60;
    }
  }
  else {
    iVar1 = encode_uint_constructor(encoder_output,context,value < 0x100);
    if ((iVar1 == 0) &&
       (iVar1 = encode_uint_value(encoder_output,context,value,value < 0x100), iVar1 == 0)) {
      l._0_4_ = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                  ,"encode_uint",0xa70,1,"Failed encoding uint");
      }
      l._0_4_ = 0xa71;
    }
  }
  return (int)l;
}

Assistant:

static int encode_uint(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, uint32_t value)
{
    int result;

    if (value == 0)
    {
        /* uint0 */
        /* Codes_SRS_AMQPVALUE_01_279: [<encoding name="uint0" code="0x43" category="fixed" width="0" label="the uint value 0"/>] */
        if (output_byte(encoder_output, context, 0x43) != 0)
        {
            LogError("Failed encoding uint");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }
    else
    {
        bool use_smallest = (value <= 255);

        if ((encode_uint_constructor(encoder_output, context, use_smallest) != 0) ||
            (encode_uint_value(encoder_output, context, value, use_smallest) != 0))
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Failed encoding uint");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }

    return result;
}